

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::vector<bool,true>>
          (Serializer *this,field_id_t field_id,char *tag,vector<bool,_true> *value)

{
  byte bVar1;
  
  if ((((this->options).serialize_default_values == false) &&
      ((value->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>
       ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
       (value->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>
       ._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p)) &&
     ((value->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
      _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
    bVar1 = 0;
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
  }
  else {
    (*this->_vptr_Serializer[4])(this,field_id,tag,1);
    WriteValue<bool>(this,value);
    bVar1 = 1;
  }
  (*this->_vptr_Serializer[5])(this,(ulong)bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}